

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_extrap_vel_to_faces.cpp
# Opt level: O0

void EBMOL::ExtrapVelToFaces
               (MultiFab *a_vel,MultiFab *a_umac,MultiFab *a_vmac,MultiFab *a_wmac,Geometry *a_geom,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec)

{
  bool bVar1;
  FabFactory<amrex::FArrayBox> *pFVar2;
  MultiCutFab *in_R8;
  FabArray<amrex::FArrayBox> *in_R9;
  Array4<const_double> vfrac;
  Array4<const_double> *ccc;
  Array4<const_double> *fcz;
  Array4<const_double> *fcy;
  Array4<const_double> *fcx;
  Box result;
  FabType typ;
  Array4<const_amrex::EBCellFlag> *flagarr;
  EBCellFlagFab *flagfab;
  Box *bx;
  Array4<const_double> *vcc;
  Array4<double> *w;
  Array4<double> *v;
  Array4<double> *u;
  Box *wbx;
  Box *vbx;
  Box *ubx;
  MFIter mfi;
  MultiCutFab *ccent;
  Array<const_MultiCutFab_*,_3> *fcent;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *fact;
  Array4<double> *in_stack_00000698;
  Array4<double> *in_stack_000006a0;
  Array4<double> *in_stack_000006a8;
  Box *in_stack_000006b0;
  Box *in_stack_000006b8;
  Box *in_stack_000006c0;
  Array4<const_double> *in_stack_000006d0;
  Array4<const_amrex::EBCellFlag> *in_stack_000006d8;
  Array4<const_double> *in_stack_000006e0;
  Array4<const_double> *in_stack_000006e8;
  Array4<const_double> *in_stack_000006f0;
  Array4<const_double> *in_stack_000006f8;
  Array4<const_double> *in_stack_00000700;
  Geometry *in_stack_00000708;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00000710;
  BCRec *in_stack_00000718;
  MFIter *in_stack_fffffffffffff888;
  MFIter *ubx_00;
  undefined8 in_stack_fffffffffffff890;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff898;
  undefined8 in_stack_fffffffffffff8b0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffff8b8;
  MFIter *in_stack_fffffffffffff8c0;
  anon_class_64_1_54a39815 *in_stack_fffffffffffff8d8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff8e0;
  MFIter *in_stack_fffffffffffff8f0;
  undefined1 *in_stack_fffffffffffff8f8;
  MFIter *in_stack_fffffffffffff900;
  Box *in_stack_fffffffffffff9b0;
  EBCellFlagFab *in_stack_fffffffffffff9b8;
  undefined1 local_618 [64];
  undefined1 *local_5d8;
  MFIter local_5d0;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> **local_548;
  undefined1 local_540 [272];
  pointer local_430;
  pointer local_428;
  undefined4 local_420;
  FabType local_41c;
  Array4<const_amrex::EBCellFlag> local_418;
  undefined8 local_3d8;
  undefined8 local_3d0;
  element_type *local_3a8;
  Array4<double> *in_stack_fffffffffffffc78;
  Array4<double> *in_stack_fffffffffffffc80;
  Array4<double> *in_stack_fffffffffffffc88;
  Box *in_stack_fffffffffffffc90;
  Box *in_stack_fffffffffffffc98;
  undefined1 local_358 [8];
  Array4<const_double> *in_stack_fffffffffffffcb0;
  RefID in_stack_fffffffffffffcb8;
  RefID in_stack_fffffffffffffcc0;
  BCRec *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  undefined1 local_2c8 [64];
  undefined1 *local_288;
  undefined1 local_27c [28];
  undefined1 *local_260;
  undefined1 local_254 [28];
  undefined1 *local_238;
  undefined1 local_22c [28];
  undefined1 *local_210;
  MFIter local_208;
  MultiCutFab *local_1a8;
  undefined1 local_1a0 [24];
  undefined1 *local_188;
  FabArray<amrex::EBCellFlagFab> *local_180;
  long local_178;
  FabArray<amrex::FArrayBox> *local_170;
  MultiCutFab *local_168;
  EBCellFlagFab *local_140;
  undefined4 local_134;
  element_type *local_130;
  Dim3 local_128;
  Dim3 local_114;
  Dim3 local_108;
  Dim3 local_f8;
  int local_ec;
  Box *local_e8;
  EBCellFlag *local_e0;
  Dim3 local_d8;
  Box *local_c8;
  int local_bc;
  int iStack_b8;
  int local_b4;
  Dim3 local_b0;
  Box *local_a0;
  int local_98;
  int iStack_94;
  int local_90;
  undefined4 local_8c;
  IntVect *local_88;
  undefined4 local_7c;
  IntVect *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  Box *local_48;
  undefined4 local_3c;
  Box *local_38;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff8b0 >> 0x38);
  local_170 = in_R9;
  local_168 = in_R8;
  pFVar2 = amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0xdf28d6);
  local_178 = __dynamic_cast(pFVar2,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_178 != 0) {
    local_180 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_fffffffffffff890);
    amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff890);
    local_188 = local_1a0;
    local_1a8 = amrex::EBFArrayBoxFactory::getCentroid
                          ((EBFArrayBoxFactory *)in_stack_fffffffffffff890);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,(bool)do_tiling_);
    while (bVar1 = amrex::MFIter::isValid(&local_208), bVar1) {
      amrex::MFIter::nodaltilebox
                (in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20));
      local_210 = local_22c;
      amrex::MFIter::nodaltilebox
                (in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20));
      local_238 = local_254;
      amrex::MFIter::nodaltilebox
                (in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20));
      local_260 = local_27c;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff898,(MFIter *)in_stack_fffffffffffff890);
      local_288 = local_2c8;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff898,(MFIter *)in_stack_fffffffffffff890);
      local_2d0 = local_310;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff898,(MFIter *)in_stack_fffffffffffff890);
      ubx_00 = (MFIter *)&stack0xfffffffffffffc60;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff898,(MFIter *)in_stack_fffffffffffff890);
      amrex::MFIter::tilebox(in_stack_fffffffffffff8f0);
      local_3a8 = (element_type *)&stack0xfffffffffffffc3c;
      local_3d0 = amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                            ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff890,
                             in_stack_fffffffffffff888);
      local_e0 = (((EBCellFlagFab *)local_3d0)->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_e8 = &(((EBCellFlagFab *)local_3d0)->super_BaseFab<amrex::EBCellFlag>).domain;
      local_ec = (((EBCellFlagFab *)local_3d0)->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_3c = 0;
      local_bc = (local_e8->smallend).vect[0];
      local_4c = 1;
      iStack_b8 = (((EBCellFlagFab *)local_3d0)->super_BaseFab<amrex::EBCellFlag>).domain.smallend.
                  vect[1];
      local_108.x = (local_e8->smallend).vect[0];
      local_108.y = (local_e8->smallend).vect[1];
      local_5c = 2;
      local_108.z = (((EBCellFlagFab *)local_3d0)->super_BaseFab<amrex::EBCellFlag>).domain.smallend
                    .vect[2];
      local_68 = &(((EBCellFlagFab *)local_3d0)->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_6c = 0;
      local_98 = local_68->vect[0] + 1;
      local_78 = &(((EBCellFlagFab *)local_3d0)->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_7c = 1;
      iStack_94 = (((EBCellFlagFab *)local_3d0)->super_BaseFab<amrex::EBCellFlag>).domain.bigend.
                  vect[1] + 1;
      local_88 = &(((EBCellFlagFab *)local_3d0)->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_8c = 2;
      local_128.z = (((EBCellFlagFab *)local_3d0)->super_BaseFab<amrex::EBCellFlag>).domain.bigend.
                    vect[2] + 1;
      local_128.y = iStack_94;
      local_128.x = local_98;
      local_140 = (EBCellFlagFab *)local_3d0;
      local_114._0_8_ = local_128._0_8_;
      local_114.z = local_128.z;
      local_f8._0_8_ = local_108._0_8_;
      local_f8.z = local_108.z;
      local_d8._0_8_ = local_108._0_8_;
      local_d8.z = local_108.z;
      local_c8 = local_e8;
      local_b4 = local_108.z;
      local_b0._0_8_ = local_128._0_8_;
      local_b0.z = local_128.z;
      local_a0 = local_e8;
      local_90 = local_128.z;
      local_58 = local_e8;
      local_48 = local_e8;
      local_38 = local_e8;
      amrex::Array4<const_amrex::EBCellFlag>::Array4
                (&local_418,local_e0,&local_f8,&local_114,local_ec);
      local_3d8 = &local_418;
      local_130 = local_3a8;
      local_134 = 2;
      local_540._264_8_ =
           (local_3a8->m_pmap).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
      local_430 = (pointer)(local_3a8->m_pmap).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      local_428 = (pointer)(local_3a8->m_pmap).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      local_420 = *(undefined4 *)
                   &(local_3a8->m_index_array).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
      amrex::Box::grow((Box *)(local_540 + 0x108),2);
      local_41c = amrex::EBCellFlagFab::getType(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0)
      ;
      if (local_41c == covered) {
        memcpy(local_540 + 200,local_288,0x3c);
        amrex::
        ParallelFor<EBMOL::ExtrapVelToFaces(amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__0>
                  ((Box *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
        memcpy(local_540 + 0x88,local_2d0,0x3c);
        amrex::
        ParallelFor<EBMOL::ExtrapVelToFaces(amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__1>
                  ((Box *)in_stack_fffffffffffff8e0,
                   (anon_class_64_1_54a39816 *)in_stack_fffffffffffff8d8);
        memcpy(local_540 + 0x48,local_358,0x3c);
        amrex::
        ParallelFor<EBMOL::ExtrapVelToFaces(amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__2>
                  ((Box *)in_stack_fffffffffffff8e0,
                   (anon_class_64_1_54a39817 *)in_stack_fffffffffffff8d8);
        ubx_00 = in_stack_fffffffffffff888;
      }
      else if (local_41c == singlevalued) {
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff890,
                   (size_type)in_stack_fffffffffffff888);
        in_stack_fffffffffffff8e0 = (FabArray<amrex::FArrayBox> *)local_540;
        in_stack_fffffffffffff900 = &local_208;
        amrex::MultiCutFab::const_array
                  ((MultiCutFab *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
        local_540._64_8_ = in_stack_fffffffffffff8e0;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff890,
                   (size_type)in_stack_fffffffffffff888);
        amrex::MultiCutFab::const_array
                  ((MultiCutFab *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
        local_548 = &local_5d0.tile_array;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff890,
                   (size_type)in_stack_fffffffffffff888);
        in_stack_fffffffffffff8f0 = &local_5d0;
        amrex::MultiCutFab::const_array
                  ((MultiCutFab *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
        in_stack_fffffffffffff8f8 = local_618;
        local_5d0.local_index_map = (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8f0;
        amrex::MultiCutFab::const_array
                  ((MultiCutFab *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
        local_5d8 = in_stack_fffffffffffff8f8;
        amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff890);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff898,(MFIter *)in_stack_fffffffffffff890);
        in_stack_fffffffffffff890 = local_3d8;
        in_stack_fffffffffffff898 = (FabArray<amrex::FArrayBox> *)local_540._64_8_;
        ExtrapVelToFacesBox(in_stack_000006c0,in_stack_000006b8,in_stack_000006b0,in_stack_000006a8,
                            in_stack_000006a0,in_stack_00000698,in_stack_000006d0,in_stack_000006d8,
                            in_stack_000006e0,in_stack_000006e8,in_stack_000006f0,in_stack_000006f8,
                            in_stack_00000700,in_stack_00000708,in_stack_00000710,in_stack_00000718)
        ;
      }
      else {
        in_stack_fffffffffffff890 = local_168;
        in_stack_fffffffffffff898 = local_170;
        MOL::ExtrapVelToFacesBox
                  ((Box *)ubx_00,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                   in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   in_stack_fffffffffffffcb0,(Geometry *)in_stack_fffffffffffffcb8.data,
                   (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   in_stack_fffffffffffffcc0.data,in_stack_fffffffffffffcc8);
      }
      amrex::MFIter::operator++(&local_208);
      in_stack_fffffffffffff888 = ubx_00;
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff890);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
EBMOL::ExtrapVelToFaces ( const MultiFab&  a_vel,
                          AMREX_D_DECL( MultiFab& a_umac,
                                        MultiFab& a_vmac,
                                        MultiFab& a_wmac ),
                          const Geometry&  a_geom,
                          const Vector<BCRec>& h_bcrec,
                          BCRec  const* d_bcrec)
{
    BL_PROFILE("EBMOL::ExtrapVelToFaces");

#ifdef AMREX_USE_EB
    AMREX_ASSERT(a_vel.hasEBFabFactory());
    auto const& fact  = dynamic_cast<EBFArrayBoxFactory const&>(a_vel.Factory());
    auto const& flags = fact.getMultiEBCellFlagFab();
    auto const& fcent = fact.getFaceCent();
    auto const& ccent = fact.getCentroid();
#endif

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        for (MFIter mfi(a_vel, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            AMREX_D_TERM( Box const& ubx = mfi.nodaltilebox(0);,
                          Box const& vbx = mfi.nodaltilebox(1);,
                          Box const& wbx = mfi.nodaltilebox(2););

            AMREX_D_TERM( Array4<Real> const& u = a_umac.array(mfi);,
                          Array4<Real> const& v = a_vmac.array(mfi);,
                          Array4<Real> const& w = a_wmac.array(mfi););

            Array4<Real const> const& vcc = a_vel.const_array(mfi);

#ifdef AMREX_USE_EB
            Box const& bx = mfi.tilebox();
            EBCellFlagFab const& flagfab = flags[mfi];
            Array4<EBCellFlag const> const& flagarr = flagfab.const_array();
            auto const typ = flagfab.getType(amrex::grow(bx,2));
            if (typ == FabType::covered)
            {
                amrex::ParallelFor(ubx, [u]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept { u(i,j,k) = 0.0; });
                amrex::ParallelFor(vbx, [v]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept { v(i,j,k) = 0.0; });
#if (AMREX_SPACEDIM==3)
                amrex::ParallelFor(wbx, [w]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept { w(i,j,k) = 0.0; });
#endif
            }
            else if (typ == FabType::singlevalued)
            {
                AMREX_D_TERM( Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                              Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                              Array4<Real const> const& fcz = fcent[2]->const_array(mfi););

                Array4<Real const> const& ccc = ccent.const_array(mfi);
                auto vfrac = fact.getVolFrac().const_array(mfi);

                EBMOL::ExtrapVelToFacesBox(AMREX_D_DECL(ubx,vbx,wbx),
                                           AMREX_D_DECL(u,v,w),vcc,flagarr,
                                           AMREX_D_DECL(fcx,fcy,fcz),ccc, vfrac,
                                           a_geom, h_bcrec, d_bcrec);
            }
            else
#endif
            {
                MOL::ExtrapVelToFacesBox(AMREX_D_DECL(ubx,vbx,wbx),
                                         AMREX_D_DECL(u,v,w),
                                         vcc,a_geom,h_bcrec, d_bcrec);
            }
        }
    }

}